

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int iso9660_write_header(archive_write *a,archive_entry *entry)

{
  archive_entry *a_00;
  mode_t mVar1;
  int iVar2;
  uint uVar3;
  la_int64_t lVar4;
  int *piVar5;
  size_t sVar6;
  int local_40;
  int ret;
  int r;
  isoent *isoent;
  isofile *file;
  iso9660_conflict *iso9660;
  archive_entry *entry_local;
  archive_write *a_local;
  
  local_40 = 0;
  file = (isofile *)a->format_data;
  file->hlnext = (isofile *)0x0;
  (file->parentdir).buffer_length = 0;
  *(undefined4 *)&(file->basename).s = 0;
  iso9660 = (iso9660_conflict *)entry;
  entry_local = (archive_entry *)a;
  mVar1 = archive_entry_filetype(entry);
  if ((mVar1 == 0xa000) && ((*(uint *)&file[0x14c].hlnext >> 0x17 & 3) == 0)) {
    archive_set_error((archive *)entry_local,-1,"Ignore symlink file.");
    file->hlnext = (isofile *)0x0;
    a_local._4_4_ = -0x14;
  }
  else {
    mVar1 = archive_entry_filetype((archive_entry *)iso9660);
    if ((mVar1 == 0x8000) &&
       (lVar4 = archive_entry_size((archive_entry *)iso9660), 0xffffffff < lVar4)) {
      if ((*(uint *)&file[0x14c].hlnext >> 0xe & 7) < 3) {
        archive_set_error((archive *)entry_local,-1,
                          "Ignore over %lld bytes file. This file too large.",0x100000000);
        file->hlnext = (isofile *)0x0;
        return -0x14;
      }
      *(undefined4 *)&(file->basename).s = 1;
    }
    isoent = (isoent *)isofile_new((archive_write *)entry_local,(archive_entry *)iso9660);
    if (isoent == (isoent *)0x0) {
      archive_set_error((archive *)entry_local,0xc,"Can\'t allocate data");
      a_local._4_4_ = -0x1e;
    }
    else {
      iVar2 = isofile_gen_utility_names((archive_write *)entry_local,(isofile *)isoent);
      a_local._4_4_ = iVar2;
      if (iVar2 < -0x14) {
        isofile_free((isofile *)isoent);
      }
      else {
        if (iVar2 < 0) {
          local_40 = iVar2;
        }
        if (((isoent->children).last == (isoent **)0x0) &&
           ((isoent->rbtree).rbt_ops == (archive_rb_tree_ops *)0x0)) {
          isofile_free((isofile *)isoent);
        }
        else {
          isofile_add_entry((iso9660_conflict *)file,(isofile *)isoent);
          _ret = isoent_new((isofile *)isoent);
          if (_ret == (isoent *)0x0) {
            archive_set_error((archive *)entry_local,0xc,"Can\'t allocate data");
            a_local._4_4_ = -0x1e;
          }
          else {
            if ((int)file[3].symlink.buffer_length < _ret->file->dircnt) {
              *(int *)&file[3].symlink.buffer_length = _ret->file->dircnt;
            }
            a_local._4_4_ = isoent_tree((archive_write *)entry_local,(isoent **)&ret);
            if (a_local._4_4_ == 0) {
              if ((isoent *)_ret->file == isoent) {
                mVar1 = archive_entry_filetype((archive_entry *)isoent->parent);
                if (mVar1 == 0x8000) {
                  file->hlnext = (isofile *)isoent;
                  uVar3 = archive_entry_nlink((archive_entry *)isoent->parent);
                  if ((uVar3 < 2) ||
                     (iVar2 = isofile_register_hardlink
                                        ((archive_write *)entry_local,(isofile *)isoent), iVar2 == 0
                     )) {
                    if (*(int *)&file->datanext < 0) {
                      iVar2 = __archive_mktemp((char *)0x0);
                      a_00 = entry_local;
                      *(int *)&file->datanext = iVar2;
                      if (*(int *)&file->datanext < 0) {
                        piVar5 = __errno_location();
                        archive_set_error((archive *)a_00,*piVar5,"Couldn\'t create temporary file")
                        ;
                        return -0x1e;
                      }
                    }
                    *(long *)&(isoent->dr_len).self =
                         (*(long *)((entry_local->ae_fflags_text).aes_wcs.length + 0x102f0) +
                         0x10000) -
                         *(long *)((entry_local->ae_fflags_text).aes_wcs.length + 0x102e0);
                    *(int **)&isoent->ext_off = &(isoent->dr_len).self;
                    iVar2 = zisofs_init((archive_write *)entry_local,(isofile *)isoent);
                    if (iVar2 < local_40) {
                      local_40 = iVar2;
                    }
                    sVar6 = archive_entry_size((archive_entry *)isoent->parent);
                    (file->parentdir).buffer_length = sVar6;
                    a_local._4_4_ = local_40;
                  }
                  else {
                    a_local._4_4_ = -0x1e;
                  }
                }
                else {
                  a_local._4_4_ = local_40;
                }
              }
              else {
                a_local._4_4_ = 0;
              }
            }
          }
        }
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
iso9660_write_header(struct archive_write *a, struct archive_entry *entry)
{
	struct iso9660 *iso9660;
	struct isofile *file;
	struct isoent *isoent;
	int r, ret = ARCHIVE_OK;

	iso9660 = a->format_data;

	iso9660->cur_file = NULL;
	iso9660->bytes_remaining = 0;
	iso9660->need_multi_extent = 0;
	if (archive_entry_filetype(entry) == AE_IFLNK
	    && iso9660->opt.rr == OPT_RR_DISABLED) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Ignore symlink file.");
		iso9660->cur_file = NULL;
		return (ARCHIVE_WARN);
	}
	if (archive_entry_filetype(entry) == AE_IFREG &&
	    archive_entry_size(entry) >= MULTI_EXTENT_SIZE) {
		if (iso9660->opt.iso_level < 3) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "Ignore over %lld bytes file. "
			    "This file too large.",
			    MULTI_EXTENT_SIZE);
				iso9660->cur_file = NULL;
			return (ARCHIVE_WARN);
		}
		iso9660->need_multi_extent = 1;
	}

	file = isofile_new(a, entry);
	if (file == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate data");
		return (ARCHIVE_FATAL);
	}
	r = isofile_gen_utility_names(a, file);
	if (r < ARCHIVE_WARN) {
		isofile_free(file);
		return (r);
	}
	else if (r < ret)
		ret = r;

	/*
	 * Ignore a path which looks like the top of directory name
	 * since we have already made the root directory of an ISO image.
	 */
	if (archive_strlen(&(file->parentdir)) == 0 &&
	    archive_strlen(&(file->basename)) == 0) {
		isofile_free(file);
		return (r);
	}

	isofile_add_entry(iso9660, file);
	isoent = isoent_new(file);
	if (isoent == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate data");
		return (ARCHIVE_FATAL);
	}
	if (isoent->file->dircnt > iso9660->dircnt_max)
		iso9660->dircnt_max = isoent->file->dircnt;

	/* Add the current file into tree */
	r = isoent_tree(a, &isoent);
	if (r != ARCHIVE_OK)
		return (r);

	/* If there is the same file in tree and
	 * the current file is older than the file in tree.
	 * So we don't need the current file data anymore. */
	if (isoent->file != file)
		return (ARCHIVE_OK);

	/* Non regular files contents are unneeded to be saved to
	 * temporary files. */
	if (archive_entry_filetype(file->entry) != AE_IFREG)
		return (ret);

	/*
	 * Set the current file to cur_file to read its contents.
	 */
	iso9660->cur_file = file;

	if (archive_entry_nlink(file->entry) > 1) {
		r = isofile_register_hardlink(a, file);
		if (r != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	}

	/*
	 * Prepare to save the contents of the file.
	 */
	if (iso9660->temp_fd < 0) {
		iso9660->temp_fd = __archive_mktemp(NULL);
		if (iso9660->temp_fd < 0) {
			archive_set_error(&a->archive, errno,
			    "Couldn't create temporary file");
			return (ARCHIVE_FATAL);
		}
	}

	/* Save an offset of current file in temporary file. */
	file->content.offset_of_temp = wb_offset(a);
	file->cur_content = &(file->content);
	r = zisofs_init(a, file);
	if (r < ret)
		ret = r;
	iso9660->bytes_remaining =  archive_entry_size(file->entry);

	return (ret);
}